

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O3

int nn_rep_create(void *hint,nn_sockbase **sockbase)

{
  int extraout_EAX;
  nn_xrep *self;
  undefined4 uVar1;
  undefined4 *puVar3;
  nn_sockbase **ppnVar2;
  
  puVar3 = (undefined4 *)0x200;
  ppnVar2 = sockbase;
  self = (nn_xrep *)nn_alloc_(0x200);
  uVar1 = SUB84(ppnVar2,0);
  if (self != (nn_xrep *)0x0) {
    nn_xrep_init(self,&nn_rep_sockbase_vfptr,hint);
    *(undefined4 *)&self[1].sockbase.vfptr = 0;
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_rep_create_cold_1();
  *puVar3 = uVar1;
  return extraout_EAX;
}

Assistant:

static int nn_rep_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_rep *self;

    self = nn_alloc (sizeof (struct nn_rep), "socket (rep)");
    alloc_assert (self);
    nn_rep_init (self, &nn_rep_sockbase_vfptr, hint);
    *sockbase = &self->xrep.sockbase;

    return 0;
}